

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSimSat.c
# Opt level: O0

void Dch_ManResimulateSolved_rec(Dch_Man_t *p,Aig_Obj_t *pObj)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  uint local_28;
  int nVarNum;
  Aig_Obj_t *pObjFraig;
  Aig_Obj_t *pObj_local;
  Dch_Man_t *p_local;
  
  iVar3 = Aig_ObjIsTravIdCurrent(p->pAigTotal,pObj);
  if (iVar3 == 0) {
    Aig_ObjSetTravIdCurrent(p->pAigTotal,pObj);
    iVar3 = Aig_ObjIsCi(pObj);
    if (iVar3 == 0) {
      pAVar6 = Aig_ObjFanin0(pObj);
      Dch_ManResimulateSolved_rec(p,pAVar6);
      pAVar6 = Aig_ObjFanin1(pObj);
      Dch_ManResimulateSolved_rec(p,pAVar6);
      pAVar6 = Aig_ObjFanin0(pObj);
      uVar1 = *(ulong *)&pAVar6->field_0x18;
      uVar4 = Aig_ObjFaninC0(pObj);
      pAVar6 = Aig_ObjFanin1(pObj);
      uVar2 = *(ulong *)&pAVar6->field_0x18;
      uVar5 = Aig_ObjFaninC1(pObj);
      *(ulong *)&pObj->field_0x18 =
           *(ulong *)&pObj->field_0x18 & 0xffffffffffffffdf |
           ((ulong)(((uint)(uVar1 >> 5) & 1 ^ uVar4) & ((uint)(uVar2 >> 5) & 1 ^ uVar5)) & 1) << 5;
      pAVar6 = Dch_ObjFraig(pObj);
      pAVar6 = Aig_Regular(pAVar6);
      iVar3 = Dch_ObjSatNum(p,pAVar6);
      if (0 < iVar3) {
        p->nConeThis = p->nConeThis + 1;
      }
    }
    else {
      pAVar6 = Dch_ObjFraig(pObj);
      iVar3 = Aig_IsComplement(pAVar6);
      if (iVar3 != 0) {
        __assert_fail("!Aig_IsComplement(pObjFraig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchSimSat.c"
                      ,0x79,"void Dch_ManResimulateSolved_rec(Dch_Man_t *, Aig_Obj_t *)");
      }
      iVar3 = Dch_ObjSatNum(p,pAVar6);
      if (iVar3 == 0) {
        local_28 = 0;
      }
      else {
        local_28 = sat_solver_var_value(p->pSat,iVar3);
      }
      *(ulong *)&pObj->field_0x18 =
           *(ulong *)&pObj->field_0x18 & 0xffffffffffffffdf | ((ulong)local_28 & 1) << 5;
    }
  }
  return;
}

Assistant:

void Dch_ManResimulateSolved_rec( Dch_Man_t * p, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(p->pAigTotal, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p->pAigTotal, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Aig_Obj_t * pObjFraig;
        int nVarNum;
        pObjFraig = Dch_ObjFraig( pObj );
        assert( !Aig_IsComplement(pObjFraig) );
        nVarNum = Dch_ObjSatNum( p, pObjFraig );
        // get the value from the SAT solver
        // (account for the fact that some vars may be minimized away)
        pObj->fMarkB = !nVarNum? 0 : sat_solver_var_value( p->pSat, nVarNum );
//        pObj->fMarkB = !nVarNum? Aig_ManRandom(0) & 1 : sat_solver_var_value( p->pSat, nVarNum );
        return;
    }
    Dch_ManResimulateSolved_rec( p, Aig_ObjFanin0(pObj) );
    Dch_ManResimulateSolved_rec( p, Aig_ObjFanin1(pObj) );
    pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                 & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
    // count the cone size
    if ( Dch_ObjSatNum( p, Aig_Regular(Dch_ObjFraig(pObj)) ) > 0 )
        p->nConeThis++;
}